

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorTiledInstancer::RegisterTileProperty
          (DecoratorTiledInstancer *this,String *name,bool register_fit_modes)

{
  EffectSpecification *this_00;
  pointer pcVar1;
  PropertyId PVar2;
  PropertyDefinition *pPVar3;
  allocator<char> local_152;
  allocator<char> local_151;
  allocator<char> local_150;
  allocator<char> local_14f;
  value_type local_14e;
  allocator<char> local_149;
  String local_148;
  String align_y_name;
  String align_x_name;
  String fit_name;
  String local_c8;
  String local_a8;
  String local_88;
  String local_68;
  String additional_modes;
  
  local_14e.fit = Invalid;
  local_14e.align_x = Invalid;
  local_14e.align_y = Invalid;
  local_14e.orientation = Invalid;
  CreateString_abi_cxx11_(&additional_modes,"%s-src",(name->_M_dataplus)._M_p);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fit_name,"",(allocator<char> *)&local_148);
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  pPVar3 = EffectSpecification::RegisterProperty(this_00,&additional_modes,&fit_name);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&align_x_name,"string",(allocator<char> *)&local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&align_y_name,"",(allocator<char> *)&local_c8);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&align_x_name,&align_y_name);
  local_14e.src = PropertyDefinition::GetId(pPVar3);
  ::std::__cxx11::string::~string((string *)&align_y_name);
  ::std::__cxx11::string::~string((string *)&align_x_name);
  ::std::__cxx11::string::~string((string *)&fit_name);
  ::std::__cxx11::string::~string((string *)&additional_modes);
  additional_modes._M_dataplus._M_p = (pointer)&additional_modes.field_2;
  additional_modes._M_string_length = 0;
  additional_modes.field_2._M_local_buf[0] = '\0';
  if (register_fit_modes) {
    CreateString_abi_cxx11_(&fit_name,"%s-fit",(name->_M_dataplus)._M_p);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&align_x_name,"fill",(allocator<char> *)&local_a8);
    pPVar3 = EffectSpecification::RegisterProperty(this_00,&fit_name,&align_x_name);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&align_y_name,"keyword",(allocator<char> *)&local_c8);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,
               "fill, contain, cover, scale-none, scale-down, repeat, repeat-x, repeat-y",
               (allocator<char> *)&local_88);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&align_y_name,&local_148);
    PVar2 = PropertyDefinition::GetId(pPVar3);
    local_14e.fit = PVar2;
    ::std::__cxx11::string::~string((string *)&local_148);
    ::std::__cxx11::string::~string((string *)&align_y_name);
    ::std::__cxx11::string::~string((string *)&align_x_name);
    CreateString_abi_cxx11_(&align_x_name,"%s-align-x",(name->_M_dataplus)._M_p);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&align_y_name,"center",(allocator<char> *)&local_68);
    pPVar3 = EffectSpecification::RegisterProperty(this_00,&align_x_name,&align_y_name);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"keyword",&local_14f);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"left, center, right",&local_150);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_148,&local_a8);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"length_percent",&local_151);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_152);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_c8,&local_88);
    PVar2 = PropertyDefinition::GetId(pPVar3);
    local_14e.align_x = PVar2;
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_148);
    ::std::__cxx11::string::~string((string *)&align_y_name);
    CreateString_abi_cxx11_(&align_y_name,"%s-align-y",(name->_M_dataplus)._M_p);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"center",&local_14f);
    pPVar3 = EffectSpecification::RegisterProperty(this_00,&align_y_name,&local_148);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"keyword",&local_150);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"top, center, bottom",&local_151);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_a8,&local_c8);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"length_percent",&local_152);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_149);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_88,&local_68);
    PVar2 = PropertyDefinition::GetId(pPVar3);
    local_14e.align_y = PVar2;
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_148);
    ::std::operator+(&local_68,", ",&fit_name);
    ::std::operator+(&local_88,&local_68,", ");
    ::std::operator+(&local_c8,&local_88,&align_x_name);
    ::std::operator+(&local_a8,&local_c8,", ");
    ::std::operator+(&local_148,&local_a8,&align_y_name);
    ::std::__cxx11::string::append((string *)&additional_modes);
    ::std::__cxx11::string::~string((string *)&local_148);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&align_y_name);
    ::std::__cxx11::string::~string((string *)&align_x_name);
    ::std::__cxx11::string::~string((string *)&fit_name);
  }
  CreateString_abi_cxx11_(&fit_name,"%s-orientation",(name->_M_dataplus)._M_p);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&align_x_name,"none",(allocator<char> *)&local_a8);
  pPVar3 = EffectSpecification::RegisterProperty(this_00,&fit_name,&align_x_name);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&align_y_name,"keyword",(allocator<char> *)&local_c8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"none, flip-horizontal, flip-vertical, rotate-180",
             (allocator<char> *)&local_88);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&align_y_name,&local_148);
  PVar2 = PropertyDefinition::GetId(pPVar3);
  local_14e.orientation = PVar2;
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::~string((string *)&align_y_name);
  ::std::__cxx11::string::~string((string *)&align_x_name);
  ::std::__cxx11::string::~string((string *)&fit_name);
  ::std::operator+(&align_x_name,"%s-src, %s-orientation",&additional_modes);
  pcVar1 = (name->_M_dataplus)._M_p;
  CreateString_abi_cxx11_
            (&fit_name,align_x_name._M_dataplus._M_p,pcVar1,pcVar1,pcVar1,pcVar1,pcVar1,pcVar1);
  EffectSpecification::RegisterShorthand(this_00,name,&fit_name,FallThrough);
  ::std::__cxx11::string::~string((string *)&fit_name);
  ::std::__cxx11::string::~string((string *)&align_x_name);
  ::std::
  vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ::push_back(&this->tile_property_ids,&local_14e);
  ::std::__cxx11::string::~string((string *)&additional_modes);
  return;
}

Assistant:

void DecoratorTiledInstancer::RegisterTileProperty(const String& name, bool register_fit_modes)
{
	TilePropertyIds ids = {};

	ids.src = RegisterProperty(CreateString("%s-src", name.c_str()), "").AddParser("string").GetId();

	String additional_modes;

	if (register_fit_modes)
	{
		String fit_name = CreateString("%s-fit", name.c_str());
		ids.fit = RegisterProperty(fit_name, "fill")
					  .AddParser("keyword", "fill, contain, cover, scale-none, scale-down, repeat, repeat-x, repeat-y")
					  .GetId();

		String align_x_name = CreateString("%s-align-x", name.c_str());
		ids.align_x = RegisterProperty(align_x_name, "center").AddParser("keyword", "left, center, right").AddParser("length_percent").GetId();

		String align_y_name = CreateString("%s-align-y", name.c_str());
		ids.align_y = RegisterProperty(align_y_name, "center").AddParser("keyword", "top, center, bottom").AddParser("length_percent").GetId();

		additional_modes += ", " + fit_name + ", " + align_x_name + ", " + align_y_name;
	}

	ids.orientation = RegisterProperty(CreateString("%s-orientation", name.c_str()), "none")
						  .AddParser("keyword", "none, flip-horizontal, flip-vertical, rotate-180")
						  .GetId();

	RegisterShorthand(name,
		CreateString(("%s-src, %s-orientation" + additional_modes).c_str(), name.c_str(), name.c_str(), name.c_str(), name.c_str(), name.c_str(),
			name.c_str()),
		ShorthandType::FallThrough);

	tile_property_ids.push_back(ids);
}